

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void freeLclosure(lua_State *L,LClosure *cl)

{
  UpVal *uv;
  int i;
  LClosure *cl_local;
  lua_State *L_local;
  
  for (uv._4_4_ = 0; uv._4_4_ < (int)(uint)cl->nupvalues; uv._4_4_ = uv._4_4_ + 1) {
    if (cl->upvals[uv._4_4_] != (UpVal *)0x0) {
      luaC_upvdeccount(L,cl->upvals[uv._4_4_]);
    }
  }
  luaM_realloc_(L,cl,(long)(int)((cl->nupvalues - 1) * 8 + 0x28),0);
  return;
}

Assistant:

static void freeLclosure (lua_State *L, LClosure *cl) {
  int i;
  for (i = 0; i < cl->nupvalues; i++) {
    UpVal *uv = cl->upvals[i];
    if (uv)
      luaC_upvdeccount(L, uv);
  }
  luaM_freemem(L, cl, sizeLclosure(cl->nupvalues));
}